

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

uint32 __thiscall Clasp::Asp::PrgBody::findLit(PrgBody *this,LogicProgram *prg,Literal p)

{
  bool bVar1;
  uint32 uVar2;
  Var VVar3;
  uint uVar4;
  goal_iterator pLVar5;
  size_t *siglen;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  EVP_PKEY_CTX *ctx;
  PrgBody *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  Literal x;
  Literal *end;
  Literal *it;
  undefined4 in_stack_ffffffffffffffa8;
  Id_t in_stack_ffffffffffffffac;
  LogicProgram *in_stack_ffffffffffffffb0;
  Literal *local_20;
  
  local_20 = goals_begin((PrgBody *)0x1a2511);
  uVar2 = size(in_RDI);
  siglen = (size_t *)((ulong)uVar2 * 4);
  pLVar5 = local_20 + uVar2;
  while( true ) {
    if (local_20 == pLVar5) {
      return 0x40000000;
    }
    VVar3 = Literal::var(local_20);
    ctx = (EVP_PKEY_CTX *)(ulong)VVar3;
    LogicProgram::getAtom(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    PrgNode::literal((PrgNode *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    uVar4 = Literal::sign(local_20,ctx,(uchar *)CONCAT44(extraout_var,extraout_EDX),siglen,in_R8,
                          in_R9);
    if ((uVar4 & 1) != 0) {
      Literal::operator~((Literal *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    bVar1 = Clasp::operator==((Literal *)in_stack_ffffffffffffffb0,
                              (Literal *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (bVar1) break;
    local_20 = local_20 + 1;
  }
  pLVar5 = goals_begin((PrgBody *)0x1a25ca);
  return (uint32)((long)local_20 - (long)pLVar5 >> 2);
}

Assistant:

uint32 PrgBody::findLit(const LogicProgram& prg, Literal p) const {
	for (const Literal* it = goals_begin(), *end = it + size(); it != end; ++it) {
		Literal x = prg.getAtom(it->var())->literal();
		if (it->sign()) x = ~x;
		if (x == p) return static_cast<uint32>(it - goals_begin());
	}
	return varMax;
}